

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O1

int __thiscall FirewirePort::NumberOfUsers(FirewirePort *this)

{
  int iVar1;
  FILE *pFVar2;
  long *plVar3;
  char *pcVar4;
  ostream *poVar5;
  uint uVar6;
  string result;
  char command [256];
  char path [512];
  char *local_358;
  char *local_350;
  char local_348;
  undefined7 uStack_347;
  char local_338 [256];
  char local_238 [520];
  
  uVar6 = 0;
  sprintf(local_338,"lsof -t /dev/fw%d 2> /dev/null",(ulong)(uint)(this->super_BasePort).PortNum);
  pFVar2 = popen(local_338,"r");
  if (pFVar2 == (FILE *)0x0) {
    poVar5 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port "
               ,0x53);
    plVar3 = (long *)std::ostream::operator<<((ostream *)poVar5,(this->super_BasePort).PortNum);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  local_350 = (char *)0x0;
  local_348 = '\0';
  local_358 = &local_348;
  pcVar4 = fgets(local_238,0x200,pFVar2);
  if (pcVar4 != (char *)0x0) {
    uVar6 = 0;
    do {
      std::__cxx11::string::append((char *)&local_358);
      uVar6 = uVar6 + 1;
      pcVar4 = fgets(local_238,0x200,pFVar2);
    } while (pcVar4 != (char *)0x0);
  }
  iVar1 = pclose(pFVar2);
  if (iVar1 == -1) {
    poVar5 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"FirewirePort::NumberOfUsers: error in pclose after lsof call",0x3c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if (2 < uVar6) {
    sprintf(local_338,"lsof -R /dev/fw%d 2> /dev/null",(ulong)(uint)(this->super_BasePort).PortNum);
    pFVar2 = popen(local_338,"r");
    if (pFVar2 == (FILE *)0x0) {
      poVar5 = (this->super_BasePort).outStr;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,
                 "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port "
                 ,0x53);
      plVar3 = (long *)std::ostream::operator<<((ostream *)poVar5,(this->super_BasePort).PortNum);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
    }
    std::__cxx11::string::_M_replace((ulong)&local_358,0,local_350,0x11dd93);
    while( true ) {
      pcVar4 = fgets(local_238,0x200,pFVar2);
      if (pcVar4 == (char *)0x0) break;
      std::__cxx11::string::append((char *)&local_358);
    }
    pclose(pFVar2);
    poVar5 = (this->super_BasePort).outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"FirewirePort::NumberOfUsers: found ",0x23);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,uVar6 - 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," users",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Full lsof result:",0x11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_358,(long)local_350);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if (local_358 != &local_348) {
    operator_delete(local_358,CONCAT71(uStack_347,local_348) + 1);
  }
  return uVar6 - 1;
}

Assistant:

int FirewirePort::NumberOfUsers(void)
{
    // try to count of many users on the handle
    char command[256];
    sprintf(command, "lsof -t /dev/fw%d 2> /dev/null", PortNum);
    FILE * fp;
    int status;
    char path[512];
    fp = popen(command, "r");
    if (fp == NULL) {
        outStr << "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port " << PortNum << std::endl;
    }
    std::string result;
    int numberOfLines = 0;
    while (fgets(path, 512, fp) != NULL) {
        result.append(path);
        numberOfLines++;
    }
    status = pclose(fp);

    if (status == -1) {
        outStr << "FirewirePort::NumberOfUsers: error in pclose after lsof call" << std::endl;
    }
    int numberOfUsers = numberOfLines - 1; // lsof itself
    if (numberOfUsers > 1) {
        sprintf(command, "lsof -R /dev/fw%d 2> /dev/null", PortNum);
        fp = popen(command, "r");
        if (fp == NULL) {
            outStr << "FirewirePort::NumberOfUsers: unable to start lsof to count number of users on port " << PortNum << std::endl;
        }
        result = "";   // clear result
        while (fgets(path, 512, fp) != NULL) {
            result.append(path);
        }
        status = pclose(fp);

        outStr << "FirewirePort::NumberOfUsers: found " << numberOfUsers << " users" << std::endl
               << "Full lsof result:" << std::endl
               << result << std::endl;
    }
    return numberOfUsers;
}